

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMT_RSA_SCHEME_Unmarshal(TPMT_RSA_SCHEME *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPM_RC TVar1;
  
  TVar1 = TPMI_ALG_RSA_SCHEME_Unmarshal(&target->scheme,buffer,size,flag);
  if (TVar1 != 0) {
    return TVar1;
  }
  TVar1 = TPMU_ASYM_SCHEME_Unmarshal(&target->details,buffer,size,(uint)target->scheme);
  return TVar1;
}

Assistant:

TPM_RC
TPMT_RSA_SCHEME_Unmarshal(TPMT_RSA_SCHEME *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPMI_ALG_RSA_SCHEME_Unmarshal((TPMI_ALG_RSA_SCHEME *)&(target->scheme), buffer, size, flag);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMU_ASYM_SCHEME_Unmarshal((TPMU_ASYM_SCHEME *)&(target->details), buffer, size, (UINT32)target->scheme);
    return result;
}